

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_route.c
# Opt level: O2

void CGTFS_DatabaseRoute(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  feed_db_t db;
  route_t local_308;
  
  iVar1 = greatest_test_pre("db_route_store");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      memcpy(&local_308,&DAT_001cd598,0x2d8);
      init_feed_db(&db,"tests_tdw0.db",1);
      setup_feed_db(&db);
      fVar2 = store_route_db(&local_308,&db);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        free_feed_db(&db);
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_route.c"
        ;
        greatest_info.fail_line = 0x1c;
        greatest_info.msg = db.error_msg;
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        iVar1 = -1;
      }
    }
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseRoute) {
    RUN_TEST(db_route_store);
}